

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O3

void __thiscall features::Surf::extrema_detection(Surf *this)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pOVar6;
  ulong uVar7;
  ulong uVar8;
  int y;
  long lVar9;
  long lVar10;
  
  pOVar6 = (this->octaves).
           super__Vector_base<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->octaves).
      super__Vector_base<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>._M_impl.
      super__Vector_impl_data._M_finish != pOVar6) {
    uVar7 = 0;
    do {
      lVar10 = (long)((pOVar6[uVar7].imgs.
                       super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar3 = *(int *)(lVar10 + 8);
      iVar4 = *(int *)(lVar10 + 0xc);
      lVar10 = 1;
      do {
        lVar9 = *(long *)&(this->octaves).
                          super__Vector_base<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar7].imgs.
                          super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                          ._M_impl;
        lVar5 = *(long *)(lVar9 + lVar10 * 0x10);
        this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 8 + lVar10 * 0x10);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        if (0 < iVar4) {
          lVar9 = *(long *)(lVar5 + 0x18);
          y = 0;
          do {
            if (2 < iVar3) {
              uVar8 = 1;
              do {
                fVar2 = *(float *)(lVar9 + uVar8 * 4);
                pfVar1 = (float *)(lVar9 + -4 + uVar8 * 4);
                if ((*pfVar1 <= fVar2 && fVar2 != *pfVar1) &&
                   (pfVar1 = (float *)(lVar9 + 4 + uVar8 * 4), *pfVar1 <= fVar2 && fVar2 != *pfVar1)
                   ) {
                  check_maximum(this,(int)uVar7,(int)lVar10,(int)uVar8,y);
                }
                uVar8 = uVar8 + 1;
              } while (iVar3 - 1 != uVar8);
            }
            y = y + 1;
            lVar9 = lVar9 + (long)iVar3 * 4;
          } while (y != iVar4);
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      uVar7 = uVar7 + 1;
      pOVar6 = (this->octaves).
               super__Vector_base<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)(((long)(this->octaves).
                                    super__Vector_base<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar6 >> 3)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void
Surf::extrema_detection (void)
{
    /*
     * At this stage each octave contains 4 scale space samples and local
     * maxima/minima in the approximated DoG function need to be found.
     * To this end, a simple non-maximum suppression technique is applied.
     */
    for (std::size_t o = 0; o < this->octaves.size(); ++o)
    {
        int const width = this->octaves[o].imgs[0]->width();
        int const height = this->octaves[o].imgs[0]->height();
        for (std::size_t s = 1; s < 3; ++s)
        {
            Octave::RespImage::ConstPtr ss = this->octaves[o].imgs[s];
            Octave::RespType const* ptr = &ss->at(0);
            for (int y = 0; y < height; ++y, ptr += width)
                for (int x = 1; x + 1 < width; ++x)
                    if (ptr[x] > ptr[x-1] && ptr[x] > ptr[x + 1])
                        this->check_maximum(o, s, x, y);
        }
    }
}